

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O2

void __thiscall bsplib::A2A::exchange(A2A *this)

{
  LinCost *this_00;
  pointer puVar1;
  uint uVar2;
  unsigned_long uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer ppoVar6;
  int iVar7;
  size_t sVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  ulong uVar10;
  pointer puVar11;
  pointer puVar12;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar13;
  pointer pcVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int i_1;
  ulong uVar19;
  int i;
  long lVar20;
  long lVar21;
  size_t global_comm_send [3];
  size_t global_comm_recv [3];
  
  puVar11 = (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = 8;
  MPI_Alltoall((this->m_send_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start);
  this_00 = &this->m_lincost;
  LinCost::reset(this_00,this->m_nprocs);
  pvVar13 = extraout_RDX;
  for (lVar20 = 0; lVar20 < this->m_nprocs; lVar20 = lVar20 + 1) {
    uVar3 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar20];
    if (uVar3 != 0) {
      LinCost::send(this_00,(int)uVar3,pvVar13,(size_t)puVar11,(int)uVar15);
      pvVar13 = extraout_RDX_00;
    }
  }
  sVar8 = LinCost::get_bruck_vol(this_00);
  LinCost::reset(this_00,this->m_nprocs);
  pvVar13 = extraout_RDX_01;
  for (lVar20 = 0; lVar20 < this->m_nprocs; lVar20 = lVar20 + 1) {
    uVar3 = (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar20];
    if (uVar3 != 0) {
      LinCost::send(this_00,(int)uVar3,pvVar13,(size_t)puVar11,(int)uVar15);
      pvVar13 = extraout_RDX_02;
    }
  }
  global_comm_send[2] = LinCost::get_bruck_vol(this_00);
  if (global_comm_send[2] < sVar8) {
    global_comm_send[2] = sVar8;
  }
  puVar11 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  _Var9 = std::
          __max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar11,puVar11 + this->m_nprocs);
  global_comm_send[1] = *_Var9._M_current;
  global_comm_send[0] = this->m_send_cap;
  MPI_Allreduce(global_comm_send,global_comm_recv,3,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,
                this->m_comm);
  if (((this->m_method == RMA) && (global_comm_recv[0] != this->m_recv_cap)) &&
     (this->m_recv_win != (MPI_Win)&ompi_mpi_win_null)) {
    MPI_Win_free(&this->m_recv_win);
  }
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_recv_bufs,(long)this->m_nprocs * global_comm_recv[0]);
  if ((this->m_method == RMA) && (global_comm_recv[0] != this->m_recv_cap)) {
    MPI_Win_create((this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)this->m_nprocs * global_comm_recv[0],1,
                   &ompi_mpi_info_null,this->m_comm,&this->m_recv_win);
  }
  this->m_recv_cap = global_comm_recv[0];
  if (global_comm_recv[0] < global_comm_recv[1]) {
    __assert_fail("m_recv_cap >= max_recv",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0xa8,"void bsplib::A2A::exchange()");
  }
  if (global_comm_recv[1] == 0) {
    clear(this);
  }
  else {
    sVar8 = global_comm_recv[2];
    if (this->m_small_a2a_size_per_proc < global_comm_recv[2]) {
      sVar8 = this->m_small_a2a_size_per_proc;
    }
    lVar20 = 0;
    for (lVar21 = 0; lVar21 < this->m_nprocs; lVar21 = lVar21 + 1) {
      uVar19 = (this->m_send_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21];
      if (sVar8 <= uVar19) {
        uVar19 = sVar8;
      }
      memcpy((this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + lVar20,
             (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->m_send_cap * lVar21,uVar19);
      lVar20 = lVar20 + sVar8;
    }
    MPI_Alltoall((this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,sVar8 & 0xffffffff,&ompi_mpi_byte,
                 (this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,sVar8 & 0xffffffff,&ompi_mpi_byte,this->m_comm);
    lVar20 = 0;
    for (lVar21 = 0; uVar2 = this->m_nprocs, lVar21 < (int)uVar2; lVar21 = lVar21 + 1) {
      uVar19 = (this->m_recv_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar21];
      if (sVar8 <= uVar19) {
        uVar19 = sVar8;
      }
      memcpy((this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + this->m_recv_cap * lVar21,
             (this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + lVar20,uVar19);
      lVar20 = lVar20 + sVar8;
    }
    if (this->m_method == RMA) {
      if (this->m_recv_cap == 0) {
        __assert_fail("m_recv_cap > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                      ,0xce,"void bsplib::A2A::exchange()");
      }
      if (this->m_recv_win == (MPI_Win)&ompi_mpi_win_null) {
        __assert_fail("m_recv_win != MPI_WIN_NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                      ,0xcf,"void bsplib::A2A::exchange()");
      }
      MPI_Win_fence(0);
      for (uVar19 = 0; (long)uVar19 < (long)this->m_nprocs; uVar19 = uVar19 + 1) {
        uVar16 = (this->m_send_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19];
        uVar10 = sVar8;
        if (uVar16 < sVar8) {
          uVar10 = uVar16;
        }
        lVar21 = this->m_send_cap * uVar19 + uVar10;
        lVar20 = (long)this->m_pid * this->m_recv_cap + uVar10;
        for (uVar16 = uVar16 - uVar10; uVar16 != 0; uVar16 = uVar16 - uVar10) {
          uVar10 = this->m_max_msg_size;
          if (uVar16 < this->m_max_msg_size) {
            uVar10 = uVar16;
          }
          MPI_Put((this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar21,uVar10 & 0xffffffff,&ompi_mpi_byte,
                  uVar19 & 0xffffffff,lVar20,uVar10 & 0xffffffff,&ompi_mpi_byte,this->m_recv_win);
          lVar21 = lVar21 + uVar10;
          lVar20 = lVar20 + uVar10;
        }
      }
      MPI_Win_fence(0,this->m_recv_win);
    }
    else if (this->m_method == MSG) {
      puVar11 = (this->m_send_sizes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar12 = (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->m_recv_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar16 = 0;
      uVar19 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar19 = uVar16;
      }
      for (; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        uVar10 = puVar11[uVar16];
        uVar17 = sVar8;
        if (uVar10 < sVar8) {
          uVar17 = uVar10;
        }
        uVar18 = puVar4[uVar16];
        if (sVar8 <= uVar18) {
          uVar18 = sVar8;
        }
        puVar11[uVar16] = uVar10 - uVar17;
        puVar12[uVar16] = this->m_send_cap * uVar16 + uVar17;
        puVar1 = puVar4 + uVar16;
        *puVar1 = *puVar1 - uVar18;
        puVar5[uVar16] = this->m_recv_cap * uVar16 + uVar18;
      }
      global_comm_send[0] = CONCAT44(global_comm_send[0]._4_4_,0xffff8002);
      uVar19 = 1;
      do {
        lVar20 = 0;
        for (uVar16 = 0; (long)uVar16 < (long)this->m_nprocs; uVar16 = uVar16 + 1) {
          ppoVar6 = (this->m_reqs).
                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (*(undefined **)((long)ppoVar6 + lVar20) == &ompi_request_null) {
            puVar11 = (this->m_recv_sizes).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar10 = *(ulong *)((long)puVar11 + lVar20);
            uVar17 = this->m_max_msg_size;
            if (uVar10 < this->m_max_msg_size) {
              uVar17 = uVar10;
            }
            puVar12 = (this->m_recv_pos).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (uVar17 != 0) {
              MPI_Irecv((this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + *(long *)((long)puVar12 + lVar20),
                        uVar17 & 0xffffffff,&ompi_mpi_byte,uVar16 & 0xffffffff,0,this->m_comm,
                        (long)ppoVar6 + lVar20);
              puVar11 = (this->m_recv_sizes).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar12 = (this->m_recv_pos).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar10 = *(ulong *)((long)puVar11 + lVar20);
            }
            *(ulong *)((long)puVar11 + lVar20) = uVar10 - uVar17;
            *(long *)((long)puVar12 + lVar20) = *(long *)((long)puVar12 + lVar20) + uVar17;
          }
          lVar20 = lVar20 + 8;
        }
        if ((char)uVar19 != '\0') {
          MPI_Barrier(this->m_comm);
        }
        for (uVar16 = 0; (long)uVar16 < (long)this->m_nprocs; uVar16 = uVar16 + 1) {
          iVar7 = this->m_nprocs + (int)uVar16;
          ppoVar6 = (this->m_reqs).
                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (ppoVar6[iVar7] == (ompi_request_t *)&ompi_request_null) {
            uVar10 = (this->m_send_sizes).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
            uVar17 = this->m_max_msg_size;
            if (uVar10 < this->m_max_msg_size) {
              uVar17 = uVar10;
            }
            if (uVar17 != 0) {
              ppoVar6 = ppoVar6 + iVar7;
              pcVar14 = (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (this->m_send_pos).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
              if ((char)uVar19 == '\0') {
                MPI_Isend(pcVar14,uVar17 & 0xffffffff,&ompi_mpi_byte,uVar16 & 0xffffffff,0,
                          this->m_comm,ppoVar6);
              }
              else {
                MPI_Irsend(pcVar14,uVar17 & 0xffffffff,&ompi_mpi_byte,uVar16 & 0xffffffff,0,
                           this->m_comm,ppoVar6);
              }
            }
            puVar11 = (this->m_send_sizes).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar16;
            *puVar11 = *puVar11 - uVar17;
            puVar11 = (this->m_send_pos).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar16;
            *puVar11 = *puVar11 + uVar17;
          }
        }
        ppoVar6 = (this->m_reqs).
                  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar19 = 0;
        MPI_Waitsome((ulong)((long)(this->m_reqs).
                                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar6) >> 3,
                     ppoVar6,global_comm_send,
                     (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,0);
      } while ((int)global_comm_send[0] != -0x7ffe);
      uVar2 = this->m_nprocs;
      puVar11 = (this->m_send_sizes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar12 = (this->m_recv_sizes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppoVar6 = (this->m_reqs).
                super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar4 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar16 = 0;
      if (0 < (int)uVar2) {
        uVar16 = (ulong)uVar2;
      }
      for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
        if (puVar12[uVar19] != 0) {
          __assert_fail("m_recv_sizes[p] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x134,"void bsplib::A2A::exchange()");
        }
        if (puVar11[uVar19] != 0) {
          __assert_fail("m_send_sizes[p] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x135,"void bsplib::A2A::exchange()");
        }
        if (ppoVar6[uVar19] != (ompi_request_t *)&ompi_request_null) {
          __assert_fail("m_reqs[p] == MPI_REQUEST_NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x136,"void bsplib::A2A::exchange()");
        }
        if (ppoVar6[(long)(int)uVar2 + uVar19] != (ompi_request_t *)&ompi_request_null) {
          __assert_fail("m_reqs[m_nprocs+p] == MPI_REQUEST_NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                        ,0x137,"void bsplib::A2A::exchange()");
        }
        puVar12[uVar19] = puVar4[uVar19] - this->m_recv_cap * uVar19;
      }
    }
  }
  this->m_send_cap = this->m_recv_cap;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_send_bufs,(long)this->m_nprocs * this->m_recv_cap);
  puVar11 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar12 = (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar16 = 0;
  uVar19 = (ulong)(uint)this->m_nprocs;
  if (this->m_nprocs < 1) {
    uVar19 = uVar16;
  }
  for (; uVar19 != uVar16; uVar16 = uVar16 + 1) {
    puVar11[uVar16] = 0;
    puVar12[uVar16] = 0;
    puVar4[uVar16] = 0;
  }
  return;
}

Assistant:

void A2A::exchange( )
{
    std::size_t max_recv = 0, max_bruck_vol = 0;
    std::size_t new_cap = m_send_cap;
    {   
#ifdef PROFILE
        TicToc t( TicToc::MPI_META_A2A, 4*sizeof(std::size_t)*m_nprocs );
#endif

        // exchange data sizes. 
        MPI_Alltoall( m_send_sizes.data(), sizeof(std::size_t), MPI_BYTE,
                m_recv_sizes.data(), sizeof(std::size_t), MPI_BYTE,
                m_comm );

        // determine ideal nr of bytes to send over MPI_Alltoall
        m_lincost.reset( m_nprocs );
        for ( int i = 0; i < m_nprocs; ++i ) 
            if ( m_send_sizes[i] > 0 )
                m_lincost.send( m_send_sizes[i]);

        std::size_t pref_bruck_vol = m_lincost.get_bruck_vol();

        m_lincost.reset( m_nprocs );
        for ( int i = 0; i < m_nprocs; ++i ) 
            if ( m_recv_sizes[i] > 0 )
                m_lincost.send( m_recv_sizes[i]);

        // Determine max communication sizes
        pref_bruck_vol = 
            std::max( pref_bruck_vol, m_lincost.get_bruck_vol() );

        std::size_t max_send = *std::max_element( m_send_sizes.begin(),
                               m_send_sizes.begin() + m_nprocs );

        std::size_t global_comm_send[3] = 
            { m_send_cap, max_send, pref_bruck_vol };
        std::size_t global_comm_recv[3];

        MPI_Allreduce( global_comm_send, global_comm_recv,
                3, MY_MPI_SIZE_T, MPI_MAX, m_comm );

        new_cap       = global_comm_recv[0];
        max_recv      = global_comm_recv[1];
        max_bruck_vol = global_comm_recv[2];
    }

    // Ensure correct size memory of recv buffers
    if ( m_method == RMA && 
            new_cap != m_recv_cap && m_recv_win != MPI_WIN_NULL )
        MPI_Win_free( &m_recv_win );

    m_recv_bufs.resize( new_cap * m_nprocs );

    if ( m_method == RMA && new_cap != m_recv_cap ) {
        MPI_Win_create( m_recv_bufs.data(), 
                new_cap * m_nprocs, 1, 
                MPI_INFO_NULL, m_comm, &m_recv_win );
    }
    m_recv_cap = new_cap;

    assert( m_recv_cap >= max_recv );

    if ( max_recv == 0 ) {
        /* no need to do anything */
        clear();
    }
    else  {
        std::size_t sm = std::min( max_bruck_vol, m_small_a2a_size_per_proc ) ;
        {
#ifdef PROFILE
        TicToc t( TicToc::MPI_SMALL_A2A );
#endif
        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t size = std::min( sm, m_send_sizes[p]);
            memcpy( m_small_send_buf.data() + p * sm,
                    m_send_bufs.data() + p * m_send_cap,
                    size);
#ifdef PROFILE
            t.add_bytes( sm );
#endif
        }
        // In small exchanges, Bruck's algorithm will be used again
        MPI_Alltoall( m_small_send_buf.data(), int(sm), MPI_BYTE,
                m_small_recv_buf.data(), int(sm), MPI_BYTE,
                m_comm );

        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t size = std::min( sm, m_recv_sizes[p]);
            memcpy( m_recv_bufs.data() + p * m_recv_cap,
                    m_small_recv_buf.data() + p * sm,
                    size );
        }
        } // end plain all-to-all
        // start normal message exchange
        if ( m_method == RMA) { 
#ifdef PROFILE
        TicToc t( TicToc::MPI_PUT );
#endif
        assert( m_recv_cap > 0 );
        assert( m_recv_win != MPI_WIN_NULL );

        MPI_Win_fence( 0, m_recv_win );

        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t o = std::min( sm, m_send_sizes[p] );
            std::size_t size = m_send_sizes[p] - o;
            std::size_t o1 = m_send_cap * p + o;
            std::size_t o2 = m_recv_cap * m_pid + o;
#ifdef PROFILE
            t.add_bytes( size );
#endif
            while ( size > 0 ) {
                std::size_t s = std::min( m_max_msg_size, size );
                //size_t s = size;
                MPI_Put( m_send_bufs.data() + o1, int(s), MPI_BYTE,
                        p, o2, int(s), MPI_BYTE, m_recv_win );
                size -= s;
                o1 += s;
                o2 += s;
            }
        }

        MPI_Win_fence( 0, m_recv_win );
        } else if ( m_method == MSG ) {

#ifdef PROFILE
        TicToc tr( TicToc::MPI_LARGE_RECV );
        TicToc ts( TicToc::MPI_LARGE_SEND );
#endif

        for ( int p = 0 ; p < m_nprocs; ++p ) {
            std::size_t so = std::min( sm, m_send_sizes[p] );
            std::size_t ro = std::min( sm, m_recv_sizes[p] );

            m_send_sizes[p] -= so;
            m_send_pos[p] = p * m_send_cap + so;

            m_recv_sizes[p] -= ro;
            m_recv_pos[p] = p * m_recv_cap + ro;
        }

        // Do a personalized exchange
        int outcount = MPI_UNDEFINED;
        bool first_time = true;
        do {
            for (int p = 0; p < m_nprocs; ++p ) {
                if (m_reqs[p] != MPI_REQUEST_NULL) continue;

                std::size_t recv_size 
                    = std::min( m_max_msg_size, m_recv_sizes[p] );
#ifdef PROFILE
                tr.add_bytes( recv_size );
#endif

                int tag = 0;
                if (recv_size > 0 )
                    MPI_Irecv( m_recv_bufs.data() + m_recv_pos[p],
                            int( recv_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[p] );
                
                m_recv_sizes[p] -= recv_size;
                m_recv_pos[p] += recv_size;
            }

            if (first_time)
                MPI_Barrier( m_comm ); // Using the barrier the first time
                                       // allows to use ready sends

            for (int p = 0; p < m_nprocs; ++p ) {
                if (m_reqs[m_nprocs + p] != MPI_REQUEST_NULL) continue;

                std::size_t send_size 
                    = std::min( m_max_msg_size, m_send_sizes[p] );
#ifdef PROFILE
                ts.add_bytes( send_size );
#endif

                int tag = 0;
                if (send_size > 0 ) {
                    if (first_time)
                     MPI_Irsend( m_send_bufs.data() + m_send_pos[p],
                            int( send_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[m_nprocs + p ] );
                    else
                     MPI_Isend( m_send_bufs.data() + m_send_pos[p],
                            int( send_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[m_nprocs + p ] );
                }
                
                m_send_sizes[p] -= send_size;
                m_send_pos[p] += send_size;
            }
            
            first_time = false;

            MPI_Waitsome( int( m_reqs.size() ), m_reqs.data(), &outcount, 
                    m_ready.data(), MPI_STATUSES_IGNORE );
        } while (outcount != MPI_UNDEFINED );

        for (int p = 0 ; p < m_nprocs; ++p ) {
            assert( m_recv_sizes[p] == 0 );
            assert( m_send_sizes[p] == 0 );
            assert( m_reqs[p] == MPI_REQUEST_NULL );
            assert( m_reqs[m_nprocs+p] == MPI_REQUEST_NULL );
            m_recv_sizes[p] = m_recv_pos[p] - p * m_recv_cap;
        }
    } // end of plain message exchange
    } // end of else

    m_send_cap = m_recv_cap;
    m_send_bufs.resize( m_nprocs * m_send_cap );
    for (int p = 0 ; p < m_nprocs; ++p ) {
        m_send_sizes[p] = 0;
        m_send_pos[p] = 0;
        m_recv_pos[p] = 0;
    }
}